

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_encoder.hpp
# Opt level: O3

bool __thiscall
andyzip::deflate_encoder::encode
          (deflate_encoder *this,uint8_t *dest,uint8_t *dest_max,uint8_t *src,uint8_t *src_max)

{
  FILE *__stream;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint8_t uVar6;
  bool bVar7;
  char buf [12];
  suffix_array<unsigned_char,_unsigned_int,_std::allocator> sa;
  uint8_t local_84 [12];
  suffix_array<unsigned_char,_unsigned_int,_std::allocator> local_78;
  
  __stream = fopen("1.txt","wb");
  if (src != src_max) {
    uVar3 = (long)src_max - (long)src;
    if (0xffff < uVar3) {
      uVar3 = 0x10000;
    }
    suffix_array<unsigned_char,_unsigned_int,_std::allocator>::suffix_array
              (&local_78,src,src + uVar3);
    uVar4 = 0;
    do {
      uVar1 = (ulong)(local_78.addresses_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar4] +
                     (uint)(local_78.addresses_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar4] == 0));
      if (uVar1 - 1 == uVar3) {
        lVar5 = 0;
      }
      else {
        lVar2 = 0;
        do {
          uVar6 = '.';
          if (0xa0 < (byte)(src[lVar2 + (uVar1 - 1)] + 0x81)) {
            uVar6 = src[lVar2 + (uVar1 - 1)];
          }
          lVar5 = lVar2 + 1;
          local_84[lVar2] = uVar6;
        } while ((lVar2 != 9) && (bVar7 = uVar3 - uVar1 != lVar2, lVar2 = lVar5, bVar7));
      }
      local_84[lVar5] = '\0';
      fprintf(__stream,"%8d <%s>\n",uVar4,local_84);
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar3);
    if (local_78.addr_to_sa_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.addr_to_sa_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.addr_to_sa_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.addr_to_sa_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_78.longest_common_prefix_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.longest_common_prefix_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.longest_common_prefix_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.longest_common_prefix_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_78.addresses_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.addresses_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.addresses_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.addresses_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return false;
}

Assistant:

bool encode(uint8_t *dest, uint8_t *dest_max, const uint8_t *src, const uint8_t *src_max) const {
      size_t block_size = 0x10000;
      FILE *log = fopen("1.txt", "wb");

      while (src != src_max) {
        size_t size = std::min((size_t)(src_max - src), block_size);
        suffix_array<uint8_t, uint32_t> sa(src, src + size);
        for (size_t i = 0; i != size; ++i) {
          size_t addr = sa.addr(i);
          char buf[12];
          size_t k = 0;
          for (size_t j = std::max((size_t)1u, addr)-1; k != 10 && j != size; ++j) {
            buf[k++] = src[j] < ' ' || src[j] >= 0x7f  ? '.' : src[j];
          }
          buf[k] = 0;
          fprintf(log, "%8d <%s>\n", i, buf);
        }
        break;
        src += size;
      }
      return false;
    }